

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

AffixPatternMatcher *
icu_63::numparse::impl::AffixPatternMatcher::fromAffixPattern
          (AffixPatternMatcher *__return_storage_ptr__,UnicodeString *affixPattern,
          AffixTokenMatcherWarehouse *tokenWarehouse,parse_flags_t parseFlags,bool *success,
          UErrorCode *status)

{
  UBool UVar1;
  undefined1 local_98 [8];
  AffixPatternMatcherBuilder builder;
  IgnorablesMatcher *ignorables;
  UErrorCode *status_local;
  bool *success_local;
  parse_flags_t parseFlags_local;
  AffixTokenMatcherWarehouse *tokenWarehouse_local;
  UnicodeString *affixPattern_local;
  
  UVar1 = UnicodeString::isEmpty(affixPattern);
  if (UVar1 == '\0') {
    *success = true;
    if ((parseFlags & 0x200U) == 0) {
      builder.fIgnorables = AffixTokenMatcherWarehouse::ignorables(tokenWarehouse);
    }
    else {
      builder.fIgnorables = (IgnorablesMatcher *)0x0;
    }
    AffixPatternMatcherBuilder::AffixPatternMatcherBuilder
              ((AffixPatternMatcherBuilder *)local_98,affixPattern,tokenWarehouse,
               builder.fIgnorables);
    icu_63::number::impl::AffixUtils::iterateWithConsumer
              (affixPattern,(TokenConsumer *)local_98,status);
    AffixPatternMatcherBuilder::build(__return_storage_ptr__,(AffixPatternMatcherBuilder *)local_98)
    ;
    AffixPatternMatcherBuilder::~AffixPatternMatcherBuilder((AffixPatternMatcherBuilder *)local_98);
  }
  else {
    *success = false;
    memset(__return_storage_ptr__,0,0x50);
    AffixPatternMatcher(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

AffixPatternMatcher AffixPatternMatcher::fromAffixPattern(const UnicodeString& affixPattern,
                                                          AffixTokenMatcherWarehouse& tokenWarehouse,
                                                          parse_flags_t parseFlags, bool* success,
                                                          UErrorCode& status) {
    if (affixPattern.isEmpty()) {
        *success = false;
        return {};
    }
    *success = true;

    IgnorablesMatcher* ignorables;
    if (0 != (parseFlags & PARSE_FLAG_EXACT_AFFIX)) {
        ignorables = nullptr;
    } else {
        ignorables = &tokenWarehouse.ignorables();
    }

    AffixPatternMatcherBuilder builder(affixPattern, tokenWarehouse, ignorables);
    AffixUtils::iterateWithConsumer(affixPattern, builder, status);
    return builder.build();
}